

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O3

void threadFunc(void)

{
  int v;
  Logger local_ff0;
  
  v = 0;
  do {
    Logger::Logger(&local_ff0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/tests/LoggingTest.cpp"
                   ,0xd);
    LogStream::operator<<((LogStream *)&local_ff0,v);
    Logger::~Logger(&local_ff0);
    v = v + 1;
  } while (v != 1000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======threadFunc()===========",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return;
}

Assistant:

void threadFunc(){
    for (int i=0; i<1000; ++i) {
        LOG<<i;
    }
    cout<<"=======threadFunc()==========="<<endl;
}